

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPrintVisitor.cpp
# Opt level: O0

void __thiscall CPrintVisitor::Visit(CPrintVisitor *this,CMethod *stm)

{
  initializer_list<INode_*> __l;
  allocator local_141;
  string local_140 [39];
  allocator local_119;
  string local_118 [32];
  ChildrenAnswers local_f8;
  vector<INode_*,_std::allocator<INode_*>_> local_c8;
  undefined1 local_b0 [8];
  ChildrenAnswers answers;
  allocator<INode_*> local_69;
  pointer local_68;
  pointer local_60;
  pointer local_58;
  pointer local_50;
  pointer local_48;
  pointer *local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<INode_*,_std::allocator<INode_*>_> children;
  CMethod *stm_local;
  CPrintVisitor *this_local;
  
  children.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)stm;
  local_68 = std::unique_ptr<CType,_std::default_delete<CType>_>::get(&stm->returnType);
  local_60 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::get
                       ((unique_ptr<IExpression,_std::default_delete<IExpression>_> *)
                        (children.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 4));
  local_58 = std::unique_ptr<CArgumentList,_std::default_delete<CArgumentList>_>::get
                       ((unique_ptr<CArgumentList,_std::default_delete<CArgumentList>_> *)
                        (children.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 6));
  local_50 = std::unique_ptr<CFieldList,_std::default_delete<CFieldList>_>::get
                       ((unique_ptr<CFieldList,_std::default_delete<CFieldList>_> *)
                        (children.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 8));
  local_48 = std::unique_ptr<CCompoundStm,_std::default_delete<CCompoundStm>_>::get
                       ((unique_ptr<CCompoundStm,_std::default_delete<CCompoundStm>_> *)
                        (children.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
  local_40 = &local_68;
  local_38 = 5;
  std::allocator<INode_*>::allocator(&local_69);
  __l._M_len = local_38;
  __l._M_array = (iterator)local_40;
  std::vector<INode_*,_std::allocator<INode_*>_>::vector
            ((vector<INode_*,_std::allocator<INode_*>_> *)local_30,__l,&local_69);
  std::allocator<INode_*>::~allocator(&local_69);
  std::vector<INode_*,_std::allocator<INode_*>_>::vector
            (&local_c8,(vector<INode_*,_std::allocator<INode_*>_> *)local_30);
  VisitChildren((ChildrenAnswers *)local_b0,this,&local_c8);
  std::vector<INode_*,_std::allocator<INode_*>_>::~vector(&local_c8);
  ChildrenAnswers::ChildrenAnswers(&local_f8,(ChildrenAnswers *)local_b0);
  AddChildrenAnswers(this,(ChildrenAnswers *)&local_f8);
  ChildrenAnswers::~ChildrenAnswers(&local_f8);
  if (((ulong)children.super__Vector_base<INode_*,_std::allocator<INode_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage[9] & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_140,"PrivateMethod",&local_141);
    AddLabel(this,(string *)local_140);
    std::__cxx11::string::~string(local_140);
    std::allocator<char>::~allocator((allocator<char> *)&local_141);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_118,"PublicMethod",&local_119);
    AddLabel(this,(string *)local_118);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
  }
  this->lastVisited = this->lastVisited + 1;
  ChildrenAnswers::~ChildrenAnswers((ChildrenAnswers *)local_b0);
  std::vector<INode_*,_std::allocator<INode_*>_>::~vector
            ((vector<INode_*,_std::allocator<INode_*>_> *)local_30);
  return;
}

Assistant:

void CPrintVisitor::Visit(CMethod &stm) {
	std::vector<INode*> children = { stm.returnType.get(), stm.returnExp.get(), stm.arguments.get(), stm.vars.get(), stm.statements.get() };
	ChildrenAnswers answers = VisitChildren(children);

	AddChildrenAnswers(answers);
	if (stm.isPublic) {
		AddLabel("PublicMethod");
	} else {
		AddLabel("PrivateMethod");
	}
	++lastVisited;
}